

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

M44d * Imath_3_2::procrustesRotationAndTranslation<double>
                 (M44d *__return_storage_ptr__,Vec3<double> *A,Vec3<double> *B,double *weights,
                 size_t numPoints,bool doScale)

{
  int i_3;
  long lVar1;
  double (*padVar2) [3];
  size_t sVar3;
  long lVar4;
  size_t i_1;
  double (*padVar5) [3];
  double (*A_00) [3];
  size_t i_2;
  double *pdVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  M33d C;
  double local_1e8;
  double dStack_1e0;
  M33d U;
  Matrix33<double> local_178;
  Matrix33<double> local_128;
  M33d Qt;
  V3d S;
  M33d V;
  
  if (numPoints == 0) {
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[0][1] = 0.0;
    __return_storage_ptr__->x[0][2] = 0.0;
    __return_storage_ptr__->x[0][3] = 0.0;
    __return_storage_ptr__->x[1][0] = 0.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[1][2] = 0.0;
    __return_storage_ptr__->x[1][3] = 0.0;
    __return_storage_ptr__->x[2][0] = 0.0;
    __return_storage_ptr__->x[2][1] = 0.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    __return_storage_ptr__->x[2][3] = 0.0;
    __return_storage_ptr__->x[3][0] = 0.0;
    __return_storage_ptr__->x[3][1] = 0.0;
    __return_storage_ptr__->x[3][2] = 0.0;
    __return_storage_ptr__->x[3][3] = 1.0;
  }
  else {
    if (weights == (double *)0x0) {
      auVar16 = ZEXT816(0);
      lVar1 = 0x10;
      auVar20 = ZEXT816(0);
      dVar18 = 0.0;
      dVar19 = 0.0;
      sVar3 = numPoints;
      while (bVar7 = sVar3 != 0, sVar3 = sVar3 - 1, bVar7) {
        pdVar6 = (double *)((long)A + lVar1 + -0x10);
        dVar8 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + *pdVar6;
        auVar20._8_8_ = dVar8 + pdVar6[1];
        pdVar6 = (double *)((long)B + lVar1 + -0x10);
        dVar8 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + *pdVar6;
        auVar16._8_8_ = dVar8 + pdVar6[1];
        dVar18 = dVar18 + *(double *)((long)&B->x + lVar1);
        dVar19 = dVar19 + *(double *)((long)&A->x + lVar1);
        lVar1 = lVar1 + 0x18;
      }
      auVar11._8_4_ = (int)(numPoints >> 0x20);
      auVar11._0_8_ = numPoints;
      auVar11._12_4_ = 0x45300000;
      dVar8 = (auVar11._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)numPoints) - 4503599627370496.0);
    }
    else {
      lVar1 = 2;
      auVar16 = ZEXT816(0);
      dVar8 = 0.0;
      auVar20 = ZEXT816(0);
      dVar18 = 0.0;
      dVar19 = 0.0;
      for (sVar3 = 0; numPoints != sVar3; sVar3 = sVar3 + 1) {
        dVar21 = weights[sVar3];
        dVar8 = dVar8 + dVar21;
        pdVar6 = (double *)((long)A + lVar1 * 8 + -0x10);
        dVar13 = auVar20._8_8_;
        auVar20._0_8_ = auVar20._0_8_ + *pdVar6 * dVar21;
        auVar20._8_8_ = dVar13 + pdVar6[1] * dVar21;
        pdVar6 = (double *)((long)B + lVar1 * 8 + -0x10);
        dVar13 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + *pdVar6 * dVar21;
        auVar16._8_8_ = dVar13 + pdVar6[1] * dVar21;
        dVar18 = dVar18 + (&B->x)[lVar1] * dVar21;
        dVar19 = dVar19 + (&A->x)[lVar1] * dVar21;
        lVar1 = lVar1 + 3;
      }
    }
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      local_178.x[2][2] = 0.0;
      auVar12._8_8_ = dVar8;
      auVar12._0_8_ = dVar8;
      auVar20 = divpd(auVar20,auVar12);
      dVar19 = dVar19 / dVar8;
      auVar16 = divpd(auVar16,auVar12);
      dVar18 = dVar18 / dVar8;
      local_178.x[2][0] = 0.0;
      local_178.x[2][1] = 0.0;
      local_178.x[1][1] = 0.0;
      local_178.x[1][2] = 0.0;
      local_178.x[0][2] = 0.0;
      local_178.x[1][0] = 0.0;
      local_178.x[0][0] = 0.0;
      local_178.x[0][1] = 0.0;
      dVar8 = auVar20._0_8_;
      dVar21 = auVar20._8_8_;
      local_1e8 = auVar16._0_8_;
      dStack_1e0 = auVar16._8_8_;
      if (weights == (double *)0x0) {
        lVar1 = 0x10;
        sVar3 = numPoints;
        while (bVar7 = sVar3 != 0, sVar3 = sVar3 - 1, bVar7) {
          dVar13 = *(double *)((long)&B->x + lVar1) - dVar18;
          dVar9 = *(double *)((long)&A->x + lVar1) - dVar19;
          U.x[2][2] = dVar13 * dVar9;
          pdVar6 = (double *)((long)A + lVar1 + -0x10);
          dVar10 = *pdVar6 - dVar8;
          dVar14 = pdVar6[1] - dVar21;
          pdVar6 = (double *)((long)B + lVar1 + -0x10);
          dVar15 = *pdVar6 - local_1e8;
          dVar17 = pdVar6[1] - dStack_1e0;
          U.x[0][0] = dVar15 * dVar10;
          U.x[0][1] = dVar15 * dVar14;
          U.x[0][2] = dVar9 * dVar15;
          U.x[1][0] = dVar10 * dVar17;
          U.x[1][1] = dVar17 * dVar14;
          U.x[1][2] = dVar17 * dVar9;
          U.x[2][0] = dVar13 * dVar10;
          U.x[2][1] = dVar13 * dVar14;
          Matrix33<double>::operator+=(&local_178,&U);
          lVar1 = lVar1 + 0x18;
        }
      }
      else {
        lVar1 = 2;
        for (sVar3 = 0; numPoints != sVar3; sVar3 = sVar3 + 1) {
          dVar13 = weights[sVar3];
          dVar9 = ((&B->x)[lVar1] - dVar18) * dVar13;
          dVar14 = (&A->x)[lVar1] - dVar19;
          U.x[2][2] = dVar9 * dVar14;
          pdVar6 = (double *)((long)A + lVar1 * 8 + -0x10);
          dVar15 = *pdVar6 - dVar8;
          dVar17 = pdVar6[1] - dVar21;
          pdVar6 = (double *)((long)B + lVar1 * 8 + -0x10);
          dVar10 = dVar13 * (*pdVar6 - local_1e8);
          dVar13 = dVar13 * (pdVar6[1] - dStack_1e0);
          U.x[0][0] = dVar10 * dVar15;
          U.x[0][1] = dVar10 * dVar17;
          U.x[0][2] = dVar14 * dVar10;
          U.x[1][0] = dVar15 * dVar13;
          U.x[1][1] = dVar13 * dVar17;
          U.x[1][2] = dVar13 * dVar14;
          U.x[2][0] = dVar9 * dVar15;
          U.x[2][1] = dVar9 * dVar17;
          Matrix33<double>::operator+=(&local_178,&U);
          lVar1 = lVar1 + 3;
        }
      }
      U.x[0][0] = 1.0;
      U.x[1][0] = 0.0;
      U.x[0][1] = 0.0;
      U.x[0][2] = 0.0;
      U.x[1][1] = 1.0;
      U.x[1][2] = 0.0;
      U.x[2][0] = 0.0;
      U.x[2][1] = 0.0;
      V.x[0][0] = 1.0;
      V.x[1][0] = 0.0;
      U.x[2][2] = 1.0;
      V.x[0][1] = 0.0;
      V.x[0][2] = 0.0;
      V.x[1][1] = 1.0;
      V.x[1][2] = 0.0;
      V.x[2][0] = 0.0;
      V.x[2][1] = 0.0;
      V.x[2][2] = 1.0;
      A_00 = (double (*) [3])&local_178;
      jacobiSVD<double>((Matrix33<double> *)A_00,&U,&S,&V,2.220446049250313e-16,true);
      local_128.x[0][0] = U.x[0][0];
      local_128.x[0][1] = U.x[1][0];
      local_128.x[0][2] = U.x[2][0];
      local_128.x[1][0] = U.x[0][1];
      local_128.x[1][1] = U.x[1][1];
      local_128.x[1][2] = U.x[2][1];
      local_128.x[2][0] = U.x[0][2];
      local_128.x[2][1] = U.x[1][2];
      local_128.x[2][2] = U.x[2][2];
      padVar5 = (double (*) [3])&Qt;
      Matrix33<double>::operator*(&V,&local_128);
      if (doScale && numPoints != 1) {
        pdVar6 = &A->z;
        dVar13 = 0.0;
        if (weights == (double *)0x0) {
          dVar9 = 0.0;
          while (bVar7 = numPoints != 0, numPoints = numPoints - 1, bVar7) {
            local_128.x[0][2] = *pdVar6 - dVar19;
            local_128.x[0][0] = ((Vec3<double> *)(pdVar6 + -2))->x - dVar8;
            local_128.x[0][1] = pdVar6[-1] - dVar21;
            dVar10 = Vec3<double>::length2((Vec3<double> *)&local_128);
            dVar14 = dVar9 + (dVar10 - dVar13);
            dVar13 = (dVar14 - dVar9) - (dVar10 - dVar13);
            pdVar6 = pdVar6 + 3;
            dVar9 = dVar14;
          }
        }
        else {
          dVar9 = 0.0;
          for (sVar3 = 0; numPoints != sVar3; sVar3 = sVar3 + 1) {
            dVar10 = weights[sVar3];
            local_128.x[0][2] = *pdVar6 - dVar19;
            local_128.x[0][0] = ((Vec3<double> *)(pdVar6 + -2))->x - dVar8;
            local_128.x[0][1] = pdVar6[-1] - dVar21;
            dVar14 = Vec3<double>::length2((Vec3<double> *)&local_128);
            dVar13 = dVar14 * dVar10 - dVar13;
            dVar10 = dVar9 + dVar13;
            dVar13 = (dVar10 - dVar9) - dVar13;
            pdVar6 = pdVar6 + 3;
            dVar9 = dVar10;
          }
        }
        dVar10 = 0.0;
        dVar13 = 0.0;
        for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
          padVar2 = padVar5;
          for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
            dVar10 = (*(double (*) [3])*padVar2)[0] * (*(double (*) [3])*A_00)[lVar4] - dVar10;
            dVar14 = dVar13 + dVar10;
            dVar10 = (dVar14 - dVar13) - dVar10;
            padVar2 = padVar2 + 1;
            dVar13 = dVar14;
          }
          padVar5 = (double (*) [3])(*padVar5 + 1);
          A_00 = A_00 + 1;
        }
        dVar13 = dVar13 / dVar9;
      }
      else {
        dVar13 = 1.0;
      }
      dVar8 = dVar8 * dVar13;
      dVar21 = dVar21 * dVar13;
      dVar19 = dVar19 * dVar13;
      __return_storage_ptr__->x[0][0] = dVar13 * Qt.x[0][0];
      __return_storage_ptr__->x[0][1] = dVar13 * Qt.x[0][1];
      __return_storage_ptr__->x[0][2] = Qt.x[0][2] * dVar13;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = dVar13 * Qt.x[1][0];
      __return_storage_ptr__->x[1][1] = dVar13 * Qt.x[1][1];
      __return_storage_ptr__->x[1][2] = Qt.x[1][2] * dVar13;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = dVar13 * Qt.x[2][0];
      __return_storage_ptr__->x[2][1] = dVar13 * Qt.x[2][1];
      __return_storage_ptr__->x[2][2] = Qt.x[2][2] * dVar13;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] =
           local_1e8 - (dVar19 * Qt.x[2][0] + dVar8 * Qt.x[0][0] + dVar21 * Qt.x[1][0]);
      __return_storage_ptr__->x[3][1] =
           dStack_1e0 - (dVar19 * Qt.x[2][1] + dVar8 * Qt.x[0][1] + dVar21 * Qt.x[1][1]);
      __return_storage_ptr__->x[3][2] =
           dVar18 - (dVar19 * Qt.x[2][2] + dVar8 * Qt.x[0][2] + dVar21 * Qt.x[1][2]);
      __return_storage_ptr__->x[3][3] = 1.0;
    }
    else {
      __return_storage_ptr__->x[0][0] = 1.0;
      __return_storage_ptr__->x[0][1] = 0.0;
      __return_storage_ptr__->x[0][2] = 0.0;
      __return_storage_ptr__->x[0][3] = 0.0;
      __return_storage_ptr__->x[1][0] = 0.0;
      __return_storage_ptr__->x[1][1] = 1.0;
      __return_storage_ptr__->x[1][2] = 0.0;
      __return_storage_ptr__->x[1][3] = 0.0;
      __return_storage_ptr__->x[2][0] = 0.0;
      __return_storage_ptr__->x[2][1] = 0.0;
      __return_storage_ptr__->x[2][2] = 1.0;
      __return_storage_ptr__->x[2][3] = 0.0;
      __return_storage_ptr__->x[3][0] = 0.0;
      __return_storage_ptr__->x[3][1] = 0.0;
      __return_storage_ptr__->x[3][2] = 0.0;
      __return_storage_ptr__->x[3][3] = 1.0;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

M44d
procrustesRotationAndTranslation (
    const Vec3<T>* A,
    const Vec3<T>* B,
    const T*       weights,
    const size_t   numPoints,
    const bool     doScale)
{
    if (numPoints == 0) return M44d ();

    // Always do the accumulation in double precision:
    V3d    Acenter (0.0);
    V3d    Bcenter (0.0);
    double weightsSum = 0.0;

    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            Acenter += (V3d) A[i];
            Bcenter += (V3d) B[i];
        }
        weightsSum = (double) numPoints;
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            weightsSum += w;

            Acenter += w * (V3d) A[i];
            Bcenter += w * (V3d) B[i];
        }
    }

    if (weightsSum == 0) return M44d ();

    Acenter /= weightsSum;
    Bcenter /= weightsSum;

    //
    // Find Q such that |Q*A - B|  (actually A-Acenter and B-Bcenter, weighted)
    // is minimized in the least squares sense.
    // From Golub/Van Loan, p.601
    //
    // A,B are 3xn
    // Let C = B A^T   (where A is 3xn and B^T is nx3, so C is 3x3)
    // Compute the SVD: C = U D V^T  (U,V rotations, D diagonal).
    // Throw away the D part, and return Q = U V^T
    M33d C (0.0);
    if (weights == 0)
    {
        for (size_t i = 0; i < numPoints; ++i)
            C += outerProduct ((V3d) B[i] - Bcenter, (V3d) A[i] - Acenter);
    }
    else
    {
        for (size_t i = 0; i < numPoints; ++i)
        {
            const double w = weights[i];
            C +=
                outerProduct (w * ((V3d) B[i] - Bcenter), (V3d) A[i] - Acenter);
        }
    }

    M33d U, V;
    V3d  S;
    jacobiSVD (C, U, S, V, std::numeric_limits<double>::epsilon (), true);

    // We want Q.transposed() here since we are going to be using it in the
    // Imath style (multiplying vectors on the right, v' = v*A^T):
    const M33d Qt = V * U.transposed ();

    double s = 1.0;
    if (doScale && numPoints > 1)
    {
        // Finding a uniform scale: let us assume the Q is completely fixed
        // at this point (solving for both simultaneously seems much harder).
        // We are trying to compute (again, per Golub and van Loan)
        //    min || s*A*Q - B ||_F
        // Notice that we've jammed a uniform scale in front of the Q.
        // Now, the Frobenius norm (the least squares norm over matrices)
        // has the neat property that it is equivalent to minimizing the trace
        // of M^T*M (see your friendly neighborhood linear algebra text for a
        // derivation).  Thus, we can expand this out as
        //   min tr (s*A*Q - B)^T*(s*A*Q - B)
        // = min tr(Q^T*A^T*s*s*A*Q) + tr(B^T*B) - 2*tr(Q^T*A^T*s*B)  by linearity of the trace
        // = min s^2 tr(A^T*A) + tr(B^T*B) - 2*s*tr(Q^T*A^T*B)        using the fact that the trace is invariant
        //                                                            under similarity transforms Q*M*Q^T
        // If we differentiate w.r.t. s and set this to 0, we get
        // 0 = 2*s*tr(A^T*A) - 2*tr(Q^T*A^T*B)
        // so
        // 2*s*tr(A^T*A) = 2*s*tr(Q^T*A^T*B)
        // s = tr(Q^T*A^T*B) / tr(A^T*A)

        KahanSum traceATA;
        if (weights == 0)
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA += ((V3d) A[i] - Acenter).length2 ();
        }
        else
        {
            for (size_t i = 0; i < numPoints; ++i)
                traceATA +=
                    ((double) weights[i]) * ((V3d) A[i] - Acenter).length2 ();
        }

        KahanSum traceBATQ;
        for (int i = 0; i < 3; ++i)
            for (int j = 0; j < 3; ++j)
                traceBATQ += Qt[j][i] * C[i][j];

        s = traceBATQ.get () / traceATA.get ();
    }

    // Q is the rotation part of what we want to return.
    // The entire transform is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin)
    //                last                                first
    // The effect of this on a point is:
    //    (translate origin to Bcenter) * Q * (translate Acenter to origin) * point
    //  = (translate origin to Bcenter) * Q * (-Acenter + point)
    //  = (translate origin to Bcenter) * (-Q*Acenter + Q*point)
    //  = (translate origin to Bcenter) * (translate Q*Acenter to origin) * Q*point
    //  = (translate Q*Acenter to Bcenter) * Q*point
    // So what we want to return is:
    //    (translate Q*Acenter to Bcenter) * Q
    //
    // In block form, this is:
    //   [ 1 0 0  | ] [       0 ] [ 1 0 0  |  ]   [ 1 0 0  | ] [           |   ]   [                 ]
    //   [ 0 1 0 tb ] [  s*Q  0 ] [ 0 1 0 -ta ] = [ 0 1 0 tb ] [  s*Q  -s*Q*ta ] = [   Q   tb-s*Q*ta ]
    //   [ 0 0 1  | ] [       0 ] [ 0 0 1  |  ]   [ 0 0 1  | ] [           |   ]   [                 ]
    //   [ 0 0 0  1 ] [ 0 0 0 1 ] [ 0 0 0  1  ]   [ 0 0 0  1 ] [ 0 0 0     1   ]   [ 0 0 0    1      ]
    // (ofc the whole thing is transposed for Imath).
    const V3d translate = Bcenter - s * Acenter * Qt;

    return M44d (
        s * Qt.x[0][0],
        s * Qt.x[0][1],
        s * Qt.x[0][2],
        T (0),
        s * Qt.x[1][0],
        s * Qt.x[1][1],
        s * Qt.x[1][2],
        T (0),
        s * Qt.x[2][0],
        s * Qt.x[2][1],
        s * Qt.x[2][2],
        T (0),
        translate.x,
        translate.y,
        translate.z,
        T (1));
}